

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNStrOneOf::gen_code(CTPNStrOneOf *this,int discard,int for_condition)

{
  tctarg_prop_id_t tVar1;
  tc_symtype_t tVar2;
  void *pvVar3;
  CTcPrsNode *pCVar4;
  size_t __n;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uchar in_stack_0000000f;
  CTcGenTarg *in_stack_00000010;
  CTPNListEle *ele;
  CTcCodeLabel *brklbl;
  vm_val_t val;
  char buf [5];
  ulong caseofs;
  int cnt;
  int i;
  CTcConstVal *c;
  CTPNConst *getNextIndex;
  CTcConstVal propc;
  CTcSymProp *propsym;
  CTcConstVal *in_stack_ffffffffffffff18;
  CTcCodeLabel *lbl;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  CTcCodeStream *ofs;
  CTcDataStream *in_stack_ffffffffffffff30;
  CTcDataStream *this_00;
  CTPNListEleBase *local_98;
  vm_val_t local_88;
  undefined1 local_75 [5];
  CTcDataStream *local_70;
  int local_68;
  int32_t local_64;
  long local_60;
  void *local_48;
  CTcConstVal local_40;
  CTcSymPropBase *local_18;
  uint local_10;
  uint local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  CTcParser::get_global_symtab(G_prs);
  local_18 = (CTcSymPropBase *)
             CTcPrsSymtab::find_or_def_prop_explicit
                       ((CTcPrsSymtab *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  tVar2 = CTcSymbolBase::get_type((CTcSymbolBase *)local_18);
  if (tVar2 == TC_SYM_PROP) {
    CTcConstVal::CTcConstVal(&local_40);
    tVar1 = CTcSymPropBase::get_prop(local_18);
    CTcConstVal::set_prop(&local_40,(uint)tVar1);
    pvVar3 = CTcPrsAllocObj::operator_new(0x2d52a0);
    CTPNConst::CTPNConst
              ((CTPNConst *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    local_48 = pvVar3;
    local_60 = (**(code **)(**(long **)(in_RDI + 0x10) + 8))();
    if (local_60 == 0) {
      __n = 0;
      lbl = (CTcCodeLabel *)0x0;
      (**(code **)(**(long **)(in_RDI + 0x18) + 0xf0))(*(long **)(in_RDI + 0x18),0,local_48,0,0);
      local_68 = CTPNListBase::get_count(*(CTPNListBase **)(in_RDI + 0x10));
      CTcGenTarg::write_op(in_stack_00000010,in_stack_0000000f);
      CTcDataStream::write2
                ((CTcDataStream *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (uint)((ulong)lbl >> 0x20));
      CTcGenTarg::note_pop((CTcGenTarg *)0x2d53fa);
      local_70 = (CTcDataStream *)CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
      for (local_64 = 1; local_64 <= local_68; local_64 = local_64 + 1) {
        vm_val_t::set_int(&local_88,local_64);
        vmb_put_dh((char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (vm_val_t *)lbl);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)local_75,(void *)0x5,__n);
        CTcDataStream::write2
                  ((CTcDataStream *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (uint)((ulong)lbl >> 0x20));
      }
      CTcDataStream::write2
                ((CTcDataStream *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (uint)((ulong)lbl >> 0x20));
      CTcCodeStream::new_label_fwd
                ((CTcCodeStream *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      local_64 = 1;
      for (local_98 = &CTPNListBase::get_head(*(CTPNListBase **)(in_RDI + 0x10))->
                       super_CTPNListEleBase;
          local_98 != (CTPNListEleBase *)0x0 && local_64 <= local_68;
          local_98 = &CTPNListEleBase::get_next(local_98)->super_CTPNListEleBase) {
        CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
        CTcDataStream::write2_at
                  (in_stack_ffffffffffffff30,(ulong)in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff24);
        pCVar4 = CTPNListEleBase::get_expr(local_98);
        (**(pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)
                  (pCVar4,(ulong)local_c,(ulong)local_10);
        CTcGenTarg::write_op(in_stack_00000010,in_stack_0000000f);
        CTcCodeStream::write_ofs2
                  ((CTcCodeStream *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   lbl,0);
        if (local_c == 0) {
          CTcGenTarg::note_pop((CTcGenTarg *)0x2d55a8);
        }
        local_64 = local_64 + 1;
        local_70 = (CTcDataStream *)((long)&local_70->_vptr_CTcDataStream + 7);
      }
      ofs = G_cs;
      this_00 = local_70;
      CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
      CTcDataStream::write2_at(this_00,(ulong)ofs,in_stack_ffffffffffffff24);
      if (local_c == 0) {
        CTcGenTarg::write_op(in_stack_00000010,in_stack_0000000f);
        CTcGenTarg::note_push((CTcGenTarg *)0x2d5648);
      }
      CTcPrsNode::def_label_pos((CTcCodeLabel *)this_00);
    }
    else {
      (**(code **)**(undefined8 **)(in_RDI + 0x10))(*(undefined8 **)(in_RDI + 0x10),0);
      (**(code **)(**(long **)(in_RDI + 0x18) + 0xf0))(*(long **)(in_RDI + 0x18),0,local_48,0,0,0,0)
      ;
      CTcGenTarg::write_op(in_stack_00000010,in_stack_0000000f);
      CTcGenTarg::note_pop((CTcGenTarg *)0x2d534f);
    }
  }
  else {
    CTcTokenizer::log_error(0x2d2c);
  }
  return;
}

Assistant:

void CTPNStrOneOf::gen_code(int discard, int for_condition)
{
    /*
     *   There are two components to the <<one of>> list.  First, there's the
     *   list of strings.  Second, there's an anonymous OneOfIndexGen object
     *   that we create; this object holds our state and generates our index
     *   values.
     *   
     *   In the simple case, the list is just a constant list of constant
     *   strings.  However, if the enclosing string is a dstring, each of
     *   these will be a dstring; and even if the outer string is an sstring,
     *   these could contain further embedded expressions, in which case they
     *   won't be constant.
     *   
     *   If the list is constant, we generate list[generator.getNextIndex()].
     *   This selects a string from the list and leaves it on the stack,
     *   which is just what our parent node wants.
     *   
     *   If the list isn't constant, we generate a switch on
     *   generator.getNextIndex(), and then fill in the case table from the
     *   list: each case label is the index, and each case's body is the code
     *   generated for the list element, followed by a 'break' to the end of
     *   the switch.  The effect once again is to pick an item from the list
     *   and push its value onto the stack.  
     */

    /* look up the getNextIndex property */
    CTcSymProp *propsym = (CTcSymProp *)G_prs->get_global_symtab()->
                          find_or_def_prop_explicit("getNextIndex", 12, FALSE);
    if (propsym->get_type() != TC_SYM_PROP)
    {
        G_tok->log_error(TCERR_ONEOF_REQ_GETNXT);
        return;
    }

    /* synthesize a constant value for the property */
    CTcConstVal propc;
    propc.set_prop(propsym->get_prop());
    CTPNConst *getNextIndex = new CTPNConst(&propc);

    /* generate the list */
    CTcConstVal *c = lst_->get_const_val();
    if (c != 0)
    {
        /* the list is a constant - push the list value */
        lst_->gen_code(FALSE, FALSE);

        /* call generator.getNextIndex() to get the next index */
        state_obj_->gen_code_member(FALSE, getNextIndex, FALSE, 0, FALSE, 0);

        /* index the list (this pops two values and pushes one) */
        G_cg->write_op(OPC_INDEX);
        G_cg->note_pop();
    }
    else
    {
        /* the list is non-constant - start by generating the index */
        state_obj_->gen_code_member(FALSE, getNextIndex, FALSE, 0, FALSE, 0);

        /* note the number of list elements */
        int i, cnt = lst_->get_count();

        /* generate the SWITCH <case_cnt> */
        G_cg->write_op(OPC_SWITCH);
        G_cs->write2(cnt);
        G_cg->note_pop();

        /* 
         *   Build the case table.  Each label is an index value; leave the
         *   jump offset zero for now, since we'll have to fill it in as we
         *   generate the code. 
         */
        ulong caseofs = G_cs->get_ofs();
        for (i = 1 ; i <= cnt ; ++i)
        {
            /* write the case label as the 1-based index value */
            char buf[VMB_DATAHOLDER];
            vm_val_t val;
            val.set_int(i);
            vmb_put_dh(buf, &val);
            G_cs->write(buf, VMB_DATAHOLDER);

            /* write a placeholder for the jump offset */
            G_cs->write2(0);
        }

        /* write a placeholder for the default case */
        G_cs->write2(0);

        /* create a forward label for the 'break' to the end of the switch */
        CTcCodeLabel *brklbl = G_cs->new_label_fwd();

        /* 
         *   Now run through the table and generate the code for each list
         *   element. 
         */
        CTPNListEle *ele;
        for (i = 1, ele = lst_->get_head() ; ele != 0 && i <= cnt ;
             ++i, caseofs += VMB_DATAHOLDER + 2, ele = ele->get_next())
        {
            /* set the jump to this case in the case table */
            G_cs->write2_at(caseofs + VMB_DATAHOLDER,
                            G_cs->get_ofs() - (caseofs + VMB_DATAHOLDER));

            /* generate the code for this list element */
            ele->get_expr()->gen_code(discard, for_condition);;

            /* generate a jump to the end of the table */
            G_cg->write_op(OPC_JMP);
            G_cs->write_ofs2(brklbl, 0);

            /* 
             *   since all of these branches proceed in parallel, only one
             *   push counts, so don't count every iteration - pretend that
             *   we've already popped the value that this case generated 
             */
            if (!discard)
                G_cg->note_pop();
        }

        /* write the default case - just push nil */
        G_cs->write2_at(caseofs, G_cs->get_ofs() - caseofs);
        if (!discard)
        {
            G_cg->write_op(OPC_PUSHNIL);
            G_cg->note_push();
        }

        /* this is the end of the switch - set the 'break' label here */
        def_label_pos(brklbl);
    }
}